

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O3

type jsoncons::binary::
     native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
               (unsigned_long val,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               d_first)

{
  pointer *ppuVar1;
  iterator __position;
  long lVar2;
  uint8_t item;
  uint8_t buf [8];
  uchar local_21;
  unsigned_long local_20;
  
  local_20 = val;
  lVar2 = 0;
  do {
    local_21 = *(uchar *)((long)&local_20 + lVar2);
    __position._M_current =
         ((d_first.container)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((d_first.container)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)d_first.container,__position
                 ,&local_21);
    }
    else {
      *__position._M_current = local_21;
      ppuVar1 = &((d_first.container)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

typename std::enable_if<Endian::native == Endian::little,void>::type
    native_to_little(T val, OutputIt d_first)
    {
        uint8_t buf[sizeof(T)];
        std::memcpy(buf, &val, sizeof(T));
        for (auto item : buf)
        {
            *d_first++ = item;
        }
    }